

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

QMultiMap<QByteArray,_int> __thiscall Generator::automaticPropertyMetaTypesHelper(Generator *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  const_reference this_00;
  long in_RSI;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
  in_RDI;
  long in_FS_OFFSET;
  QByteArray *propertyType;
  PropertyDef *p;
  QByteArray *in_stack_00000038;
  QMultiMap<QByteArray,_int> *automaticPropertyMetaTypes;
  int i;
  undefined4 in_stack_ffffffffffffff68;
  int iVar4;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
  this_01;
  iterator in_stack_ffffffffffffff88;
  QByteArray *key;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  this_01.d.ptr = in_RDI.d.ptr;
  QMultiMap<QByteArray,_int>::QMultiMap((QMultiMap<QByteArray,_int> *)0x111841);
  local_c = 0;
  while (iVar4 = local_c,
        qVar3 = QList<PropertyDef>::size((QList<PropertyDef> *)(*(long *)(in_RSI + 0x10) + 0x188)),
        iVar4 < (int)qVar3) {
    this_00 = QList<PropertyDef>::at
                        ((QList<PropertyDef> *)this_01.d.ptr,
                         CONCAT44(iVar4,in_stack_ffffffffffffff68));
    key = &this_00->type;
    bVar2 = registerableMetaType(this,in_stack_00000038);
    if ((bVar2) &&
       (bVar2 = isBuiltinType((QByteArray *)CONCAT44(iVar4,in_stack_ffffffffffffff68)), !bVar2)) {
      cxxTypeTag((QFlagsStorageHelper<TypeTag,_4>)
                 SUB84((ulong)in_stack_ffffffffffffff88._M_node >> 0x20,0));
      ::operator+((char **)this_01.d.ptr,(QByteArray *)CONCAT44(iVar4,in_stack_ffffffffffffff68));
      ::QStringBuilder::operator_cast_to_QByteArray
                ((QStringBuilder<const_char_*,_const_QByteArray_&> *)
                 CONCAT44(iVar4,in_stack_ffffffffffffff68));
      in_stack_ffffffffffffff88._M_node =
           (_Base_ptr)
           QMultiMap<QByteArray,_int>::insert
                     ((QMultiMap<QByteArray,_int> *)this_00,key,in_stack_ffffffffffffff88._M_node);
      QByteArray::~QByteArray((QByteArray *)0x111957);
    }
    local_c = local_c + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
            )(QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
              )in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QMultiMap<QByteArray, int> Generator::automaticPropertyMetaTypesHelper()
{
    QMultiMap<QByteArray, int> automaticPropertyMetaTypes;
    for (int i = 0; i < int(cdef->propertyList.size()); ++i) {
        const PropertyDef &p = cdef->propertyList.at(i);
        const QByteArray &propertyType = p.type;
        if (registerableMetaType(propertyType) && !isBuiltinType(propertyType))
            automaticPropertyMetaTypes.insert(cxxTypeTag(p.typeTag) + propertyType, i);
    }
    return automaticPropertyMetaTypes;
}